

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_write_sod(opj_j2k_t *j2k,void *tile_coder)

{
  float fVar1;
  opj_cp_t *poVar2;
  opj_cio_t *cio;
  opj_codestream_info_t *poVar3;
  opj_tccp_t *poVar4;
  opj_tcp_t *poVar5;
  opj_packet_info_t *poVar6;
  uchar *dest;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  int local_40;
  
  poVar2 = j2k->cp;
  cio = j2k->cio;
  *(undefined8 *)((long)tile_coder + 4) = *(undefined8 *)&j2k->tp_num;
  poVar3 = j2k->cstr_info;
  if (poVar3 != (opj_codestream_info_t *)0x0) {
    if ((long)poVar3->numcomps < 1) {
      iVar13 = 0;
    }
    else {
      lVar12 = 0;
      iVar13 = 0;
      do {
        if (-1 < poVar3->numdecompos[lVar12]) {
          poVar4 = poVar2->tcps->tccps;
          lVar10 = 0;
          do {
            iVar11 = 1 << ((byte)poVar4->prcw[lVar10] & 0x1f);
            iVar7 = 1 << ((byte)poVar4->prch[lVar10] & 0x1f);
            iVar11 = (int)(-iVar11 & (iVar11 + (poVar3->image_w >> ((byte)lVar10 & 0x1f))) - 1U) /
                     iVar11;
            iVar7 = (int)(-iVar7 & (iVar7 + (poVar3->image_h >> ((byte)lVar10 & 0x1f))) - 1U) /
                    iVar7;
            if (iVar11 < 2) {
              iVar11 = 1;
            }
            if (iVar7 < 2) {
              iVar7 = 1;
            }
            iVar13 = iVar13 + iVar7 * iVar11;
            lVar10 = lVar10 + 1;
          } while ((ulong)(uint)poVar3->numdecompos[lVar12] + 1 != lVar10);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != poVar3->numcomps);
      iVar13 = iVar13 * 3;
    }
    iVar13 = iVar13 * poVar3->numlayers;
    cio_write(cio,0xff58,2);
    cio_write(cio,(long)(iVar13 + 3),2);
    cio_write(cio,0,1);
    local_40 = cio_tell(cio);
    if (0 < iVar13) {
      do {
        cio_write(cio,0,1);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
  }
  cio_write(cio,0xff93,2);
  poVar3 = j2k->cstr_info;
  if ((poVar3 != (opj_codestream_info_t *)0x0) && (j2k->cur_tp_num == 0)) {
    iVar13 = j2k->curtileno;
    iVar7 = cio_tell(cio);
    j2k_add_tlmarker(iVar13,poVar3,0xff93,iVar7,0);
  }
  if (j2k->curtileno == 0) {
    iVar13 = cio_tell(cio);
    j2k->sod_start = iVar13 + j2k->pos_correction;
  }
  poVar3 = j2k->cstr_info;
  if (poVar3 != (opj_codestream_info_t *)0x0) {
    if (j2k->cur_tp_num == 0) {
      iVar7 = cio_tell(cio);
      iVar13 = j2k->curtileno;
      poVar3->tile[iVar13].end_header = iVar7 + j2k->pos_correction + -1;
      j2k->cstr_info->tile[iVar13].tileno = iVar13;
    }
    else {
      lVar12 = poVar3->tile[j2k->curtileno].packet[(long)poVar3->packno + -1].end_pos;
      iVar13 = cio_tell(cio);
      if (lVar12 < iVar13) {
        iVar13 = cio_tell(cio);
        poVar3->tile[j2k->curtileno].packet[poVar3->packno].start_pos = (long)iVar13;
      }
    }
  }
  poVar5 = poVar2->tcps;
  iVar13 = j2k->curtileno;
  iVar7 = poVar5[iVar13].numlayers;
  if (0 < (long)iVar7) {
    fVar15 = (float)(j2k->sod_start / (poVar2->tw * poVar2->th));
    lVar12 = 0;
    do {
      fVar1 = poVar5[iVar13].rates[lVar12];
      if (fVar1 <= fVar15) {
        fVar16 = 1.0;
        if (fVar1 != 0.0) goto LAB_001f3900;
      }
      else {
        fVar16 = fVar1 - fVar15;
LAB_001f3900:
        poVar5[iVar13].rates[lVar12] = fVar16;
      }
      lVar12 = lVar12 + 1;
    } while (iVar7 != lVar12);
  }
  if ((j2k->cur_tp_num == 0) &&
     (*(undefined4 *)(*(long *)(*(long *)((long)tile_coder + 0x20) + 8) + 0x350) = 0,
     poVar3 != (opj_codestream_info_t *)0x0)) {
    poVar3->packno = 0;
  }
  dest = cio_getbp(cio);
  iVar7 = cio_numbytesleft(cio);
  iVar13 = tcd_encode_tile((opj_tcd_t *)tile_coder,iVar13,dest,iVar7 + -2,poVar3);
  poVar3 = j2k->cstr_info;
  if (poVar3 != (opj_codestream_info_t *)0x0) {
    iVar7 = cio_tell(cio);
    cio_seek(cio,local_40);
    if (0 < poVar3->packno) {
      lVar12 = 0x10;
      lVar10 = 0;
      do {
        poVar6 = poVar3->tile[j2k->curtileno].packet;
        uVar8 = (*(int *)((long)&poVar6->start_pos + lVar12) -
                *(int *)((long)poVar6 + lVar12 + -0x10)) + 1;
        uVar14 = uVar8 >> 7 & 0x7f;
        uVar9 = uVar8 >> 0xe & 0x7f;
        if (uVar9 == 0) {
          if (uVar14 != 0) goto LAB_001f39eb;
        }
        else {
          cio_write(cio,(ulong)(uVar9 | 0x80),1);
LAB_001f39eb:
          cio_write(cio,(ulong)(uVar14 | 0x80),1);
        }
        cio_write(cio,(ulong)(uVar8 & 0x7f),1);
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 0x20;
      } while (lVar10 < poVar3->packno);
    }
    cio_seek(cio,iVar7);
  }
  iVar7 = cio_tell(cio);
  iVar13 = (iVar7 + iVar13) - j2k->sot_start;
  cio_seek(cio,j2k->sot_start + 6);
  cio_write(cio,(long)iVar13,4);
  cio_seek(cio,j2k->sot_start + iVar13);
  if (poVar2->cinema != OFF) {
    cio_seek(cio,j2k->tlm_start + j2k->cur_tp_num * 5 + 6);
    cio_write(cio,(long)j2k->curtileno,1);
    cio_write(cio,(long)iVar13,4);
  }
  cio_seek(cio,iVar13 + j2k->sot_start);
  return;
}

Assistant:

static void j2k_write_sod(opj_j2k_t *j2k, void *tile_coder) {
	int l, layno;
	int totlen;
	opj_tcp_t *tcp = NULL;
	opj_codestream_info_t *cstr_info = NULL;
	
	opj_tcd_t *tcd = (opj_tcd_t*)tile_coder;	/* cast is needed because of conflicts in header inclusions */
	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;

	tcd->tp_num = j2k->tp_num ;
	tcd->cur_tp_num = j2k->cur_tp_num;
	
	/* INDEX >> - PLT */
#define ROUND_UPTO(a, quanta)   (((a) + ((quanta) - 1)) & ~((quanta) - 1))
	int marker_plt_start;
	cstr_info = j2k->cstr_info;
	if (cstr_info) {
		int precno = 0;
		for (int compno = 0; compno < cstr_info->numcomps; compno++)
			for (int resno = 0; resno <= cstr_info->numdecompos[compno]; resno++) {
				int pw = 1 << cp->tcps->tccps->prcw[resno];
				int ph = 1 << cp->tcps->tccps->prch[resno];

				int ww = (cstr_info->image_w >> resno);
				ww = ROUND_UPTO(ww, pw) / pw;

				int hh = (cstr_info->image_h >> resno);
				hh = ROUND_UPTO(hh, ph) / ph;

				precno += (ww < 1 ? 1 : ww) * (hh < 1 ? 1 : hh);
			}
		int plt_num = cstr_info->numlayers * precno;

		cio_write(cio, J2K_MS_PLT, 2);
		cio_write(cio, plt_num * 3 + 2 + 1, 2);
		cio_write(cio, 0, 1);

		marker_plt_start = cio_tell(cio);
		for (int i = 0; i < plt_num * 3; ++i)
            cio_write(cio, 0, 1);
	}
	/* PLT - << INDEX */
	
	cio_write(cio, J2K_MS_SOD, 2);

	if( j2k->cstr_info && j2k->cur_tp_num==0){
	  j2k_add_tlmarker( j2k->curtileno, j2k->cstr_info, J2K_MS_SOD, cio_tell(cio), 0);
	}

	if (j2k->curtileno == 0) {
		j2k->sod_start = cio_tell(cio) + j2k->pos_correction;
	}

	/* INDEX >> */
	cstr_info = j2k->cstr_info;
	if (cstr_info) {
		if (!j2k->cur_tp_num ) {
			cstr_info->tile[j2k->curtileno].end_header = cio_tell(cio) + j2k->pos_correction - 1;
			j2k->cstr_info->tile[j2k->curtileno].tileno = j2k->curtileno;
		}
		else{
			if(cstr_info->tile[j2k->curtileno].packet[cstr_info->packno - 1].end_pos < cio_tell(cio))
				cstr_info->tile[j2k->curtileno].packet[cstr_info->packno].start_pos = cio_tell(cio);
		}
		/* UniPG>> */
#ifdef USE_JPWL
		/* update markers struct */
		j2k_add_marker(j2k->cstr_info, J2K_MS_SOD, j2k->sod_start, 2);
#endif /* USE_JPWL */
		/* <<UniPG */
	}
	/* << INDEX */
	
	tcp = &cp->tcps[j2k->curtileno];
	for (layno = 0; layno < tcp->numlayers; layno++) {
		if (tcp->rates[layno]>(j2k->sod_start / (cp->th * cp->tw))) {
			tcp->rates[layno]-=(j2k->sod_start / (cp->th * cp->tw));
		} else if (tcp->rates[layno]) {
			tcp->rates[layno]=1;
		}
	}
	if(j2k->cur_tp_num == 0){
		tcd->tcd_image->tiles->packno = 0;
		if(cstr_info)
			cstr_info->packno = 0;
	}
	
	l = tcd_encode_tile(tcd, j2k->curtileno, cio_getbp(cio), cio_numbytesleft(cio) - 2, cstr_info);
	
	/* INDEX >> - PLT */
	cstr_info = j2k->cstr_info;
	if (cstr_info) {
		int marker_end = cio_tell(cio);
		cio_seek(cio, marker_plt_start);
		for (int i = 0; i < cstr_info->packno; ++i) {
			int plen = cstr_info->tile[j2k->curtileno].packet[i].end_pos - cstr_info->tile[j2k->curtileno].packet[i].start_pos + 1;

			int b0 = plen & 0x7F;
			int b1 = (plen >> 7) & 0x7F;
			int b2 = (plen >> 14) & 0x7F;

			if (b2) {
				cio_write(cio, b2 | 0x80, 1);
				cio_write(cio, b1 | 0x80, 1);
			} else if (b1)
				cio_write(cio, b1 | 0x80, 1);
			cio_write(cio, b0, 1);
		}
		cio_seek(cio, marker_end);
	}
	/* PLT - << INDEX */
	
	/* Writing Psot in SOT marker */
	totlen = cio_tell(cio) + l - j2k->sot_start;
	cio_seek(cio, j2k->sot_start + 6);
	cio_write(cio, totlen, 4);
	cio_seek(cio, j2k->sot_start + totlen);
	/* Writing Ttlm and Ptlm in TLM marker */
	if(cp->cinema){
		cio_seek(cio, j2k->tlm_start + 6 + (5*j2k->cur_tp_num));
		cio_write(cio, j2k->curtileno, 1);
		cio_write(cio, totlen, 4);
	}
	cio_seek(cio, j2k->sot_start + totlen);
}